

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long lVar1;
  TestError *this_00;
  undefined1 *puVar2;
  string *__a;
  string *this_01;
  allocator<char> local_541;
  string shader_source;
  allocator<char> local_50c;
  allocator<char> local_50b;
  allocator<char> local_50a;
  allocator<char> local_509;
  string base_variable_string;
  string temp;
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string example_struct2;
  string example_struct1;
  string variable_basenames [8];
  string local_178 [32];
  string local_158 [16];
  undefined8 auStack_148 [2];
  string full_variable_names [8];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example_struct1,"\nvoid my_function(",(allocator<char> *)variable_basenames)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example_struct2,")\n{\n}\n\n",(allocator<char> *)variable_basenames);
  base_variable_string._M_dataplus._M_p = (pointer)&base_variable_string.field_2;
  base_variable_string._M_string_length = 0;
  base_variable_string.field_2._M_local_buf[0] = '\0';
  this_01 = variable_basenames;
  __a = full_variable_names;
  std::__cxx11::string::string<std::allocator<char>>((string *)this_01,"v1",(allocator<char> *)__a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 1),"v2",(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 2),"v3",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 3),"v4",&local_541);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 4),"v5",&local_509);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 5),"v6",&local_50a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 6),"v7",&local_50b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_basenames + 7),"v8",&local_50c);
  lVar1 = 0x10;
  do {
    puVar2 = (undefined1 *)((long)&full_variable_names[0]._M_dataplus._M_p + lVar1);
    *(undefined1 **)((long)auStack_148 + lVar1) = puVar2;
    *(undefined8 *)((long)auStack_148 + lVar1 + 8) = 0;
    *puVar2 = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x110);
  for (lVar1 = 1; lVar1 != 9; lVar1 = lVar1 + 1) {
    std::__cxx11::string::string(local_158,(string *)this_01);
    std::__cxx11::string::string<std::allocator<char>>(local_178,"[2]",(allocator<char> *)&temp);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(&shader_source,this,local_158,local_178,lVar1);
    std::__cxx11::string::operator=((string *)__a,(string *)&shader_source);
    std::__cxx11::string::~string((string *)&shader_source);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_158);
    this_01 = this_01 + 1;
    __a = __a + 1;
  }
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 0x20) {
    std::__cxx11::string::append((char *)&base_variable_string);
    std::__cxx11::string::append((string *)&base_variable_string);
    std::__cxx11::string::append((char *)&base_variable_string);
  }
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"float a",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"[2]",&local_541);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_2d8,local_2f8,1);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>(local_318,"float b",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>(local_338,"[2]",&local_541);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_318,local_338,2);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>(local_358,"float c",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>(local_378,"[2]",&local_541);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_358,local_378,3);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>(local_398,"float d",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"[2]",&local_541);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_398,local_3b8,4);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>(local_3d8,"float e",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"[2]",&local_541);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_3d8,local_3f8,5);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_3f8);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>(local_418,"float f",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>(local_438,"[2]",&local_541);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_418,local_438,6);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>(local_458,"float g",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>(local_478,"[2]",&local_541);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_458,local_478,7);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_478);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>(local_498,"float h",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"[2]",&local_541);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_498,local_4b8,8);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::string((string *)&shader_source,(string *)&base_variable_string);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  for (lVar1 = 0; lVar1 != 0xe0; lVar1 = lVar1 + 0x20) {
    std::__cxx11::string::append((string *)&shader_source);
    std::__cxx11::string::append((char *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x6b9);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((ulong)tested_shader_type) {
  default:
    goto switchD_00b8e881_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    goto switchD_00b8e881_caseD_0;
  case 3:
    break;
  case 4:
  }
  std::__cxx11::string::append((string *)&shader_source);
switchD_00b8e881_caseD_0:
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_017227d4 + *(int *)(&DAT_017227d4 + (ulong)tested_shader_type * 4)))
            (&DAT_017227d4 + *(int *)(&DAT_017227d4 + (ulong)tested_shader_type * 4),
             default_vertex_shader_source_abi_cxx11_,default_tc_shader_source_abi_cxx11_,
             default_te_shader_source_abi_cxx11_,default_geometry_shader_source_abi_cxx11_,
             default_fragment_shader_source_abi_cxx11_);
  return;
}

Assistant:

void SizedDeclarationsFunctionParams<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	size_t		dimension_index = 0;
	std::string example_struct1("\nvoid my_function(");
	std::string example_struct2(")\n"
								"{\n"
								"}\n\n");
	std::string base_variable_string;
	std::string variable_basenames[API::MAX_ARRAY_DIMENSIONS] = { "v1", "v2", "v3", "v4", "v5", "v6", "v7", "v8" };
	std::string full_variable_names[API::MAX_ARRAY_DIMENSIONS];

	for (size_t max_dimension_index = 0; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		full_variable_names[max_dimension_index] =
			this->extend_string(variable_basenames[max_dimension_index], "[2]", max_dimension_index + 1);
	}

	for (size_t max_dimension_index = 0; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		base_variable_string += "float ";
		base_variable_string += full_variable_names[max_dimension_index];
		base_variable_string += ";\n";
	}

	base_variable_string += example_struct1;
	base_variable_string += this->extend_string("float a", "[2]", 1);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float b", "[2]", 2);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float c", "[2]", 3);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float d", "[2]", 4);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float e", "[2]", 5);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float f", "[2]", 6);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float g", "[2]", 7);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float h", "[2]", 8);
	base_variable_string += example_struct2;

	std::string shader_source = base_variable_string;

	shader_source += shader_start;
	shader_source += "    my_function(";

	for (dimension_index = 0; dimension_index < API::MAX_ARRAY_DIMENSIONS - 1; dimension_index++)
	{
		shader_source += variable_basenames[dimension_index];
		shader_source += ", ";
	}

	shader_source += variable_basenames[dimension_index];
	shader_source += ");\n";

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

	/* Only the previous case should succeed, so start from index 1 rather than 0.
	 * The other cases should fail, so only compile them, rather than trying to also link them.
	 * We'll swap items 2/3, then 2/4, then 2/5, then 2/6, ...
	 * Then we'll swap items 3/4, then 3/5, ...
	 * Repeat, starting for 4/5-8, 5/6-8, 6/7-8...
	 * Finally, we'll swap items 7/8
	 */
	for (size_t swap_item = 1; swap_item < API::MAX_ARRAY_DIMENSIONS; swap_item++)
	{
		for (size_t max_dimension_index = swap_item + 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS;
			 max_dimension_index++)
		{
			std::string temp = variable_basenames[swap_item];

			shader_source							= base_variable_string;
			variable_basenames[swap_item]			= variable_basenames[max_dimension_index];
			variable_basenames[max_dimension_index] = temp;

			shader_source += shader_start;
			shader_source += "    my_function(";

			for (dimension_index = 0; dimension_index < API::MAX_ARRAY_DIMENSIONS - 1; dimension_index++)
			{
				shader_source += variable_basenames[dimension_index];
				shader_source += ", ";
			}

			shader_source += variable_basenames[dimension_index];
			shader_source += ");\n";

			temp									= variable_basenames[swap_item];
			variable_basenames[swap_item]			= variable_basenames[max_dimension_index];
			variable_basenames[max_dimension_index] = temp;

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* for (int max_dimension_index = swap_item + 1; ...) */
	}	 /* for (int swap_item = 1; ...) */
}